

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

int Acb_NtkObjMffcEstimate(Acb_Ntk_t *pNtk,int iObj)

{
  int f;
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  
  piVar3 = Acb_ObjFanins(pNtk,iObj);
  lVar5 = 0;
  iVar4 = 0;
  iVar2 = -1;
  while (lVar5 < *piVar3) {
    f = piVar3[lVar5 + 1];
    lVar5 = lVar5 + 1;
    iVar1 = Acb_ObjIsAreaCritical(pNtk,f);
    iVar4 = iVar4 + iVar1;
    if (iVar1 != 0) {
      iVar2 = f;
    }
  }
  if (iVar4 == 1) {
    piVar3 = Acb_ObjFanins(pNtk,iVar2);
    iVar4 = 1;
    for (lVar5 = 0; lVar5 < *piVar3; lVar5 = lVar5 + 1) {
      iVar2 = Acb_ObjIsAreaCritical(pNtk,piVar3[lVar5 + 1]);
      iVar4 = iVar4 + iVar2;
    }
  }
  return iVar4;
}

Assistant:

static inline int Acb_NtkObjMffcEstimate( Acb_Ntk_t * pNtk, int iObj )
{
    int k, iFanin, * pFanins, Count = 0, iFaninCrit = -1;
    Acb_ObjForEachFaninFast( pNtk, iObj, pFanins, iFanin, k )
        if ( Acb_ObjIsAreaCritical(pNtk, iFanin) )
            iFaninCrit = iFanin, Count++;
    if ( Count != 1 )
        return Count;
    Acb_ObjForEachFaninFast( pNtk, iFaninCrit, pFanins, iFanin, k )
        if ( Acb_ObjIsAreaCritical(pNtk, iFanin) )
            Count++;
    return Count;
}